

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O3

void mon_summary(wchar_t gid,int *item_list,wchar_t n,wchar_t top,wchar_t row,wchar_t col)

{
  _Bool _Var1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  uint uVar6;
  
  if (n < L'\x01') {
    uVar6 = 0;
  }
  else {
    uVar5 = 0;
    uVar6 = 0;
    do {
      uVar6 = uVar6 + l_list[default_join[item_list[(long)top + uVar5]].oid].pkills;
      uVar5 = uVar5 + 1;
    } while ((uint)n != uVar5);
  }
  if ((gid == L'\0') &&
     (_Var1 = flag_has_dbg(r_info[default_join[*item_list].oid].flags,0xc,1,
                           "(&r_info[default_join[item_list[0]].oid])->flags","RF_UNIQUE"), _Var1))
  {
    pcVar4 = "%d known uniques, %d slain.";
    uVar2 = (ulong)(uint)n;
    uVar5 = (ulong)uVar6;
  }
  else {
    if ((ulong)z_info->r_max == 0) {
      uVar5 = 0;
    }
    else {
      lVar3 = 0;
      uVar5 = 0;
      do {
        uVar5 = (ulong)((int)uVar5 + (uint)*(ushort *)(l_list->flags + lVar3 + -0x18));
        lVar3 = lVar3 + 0x78;
      } while ((ulong)z_info->r_max * 0x78 - lVar3 != 0);
    }
    pcVar4 = "Creatures slain: %d/%d (in group/in total)";
    uVar2 = (ulong)uVar6;
  }
  pcVar4 = format(pcVar4,uVar2,uVar5);
  c_prt('\x0e',pcVar4,row,col);
  return;
}

Assistant:

static void mon_summary(int gid, const int *item_list, int n, int top,
						int row, int col)
{
	int i;
	int kills = 0;

	/* Access the race */
	for (i = 0; i < n; i++) {
		int oid = default_join[item_list[i+top]].oid;
		kills += l_list[oid].pkills;
	}

	/* Different display for the first item if we've got uniques to show */
	if (gid == 0 &&
		rf_has((&r_info[default_join[item_list[0]].oid])->flags, RF_UNIQUE)) {
		c_prt(COLOUR_L_BLUE, format("%d known uniques, %d slain.", n, kills),
					row, col);
	} else {
		int tkills = 0;

		for (i = 0; i < z_info->r_max; i++)
			tkills += l_list[i].pkills;

		c_prt(COLOUR_L_BLUE, format("Creatures slain: %d/%d (in group/in total)", kills, tkills), row, col);
	}
}